

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O2

uint128 google::protobuf::operator<<(uint128 *val,int amount)

{
  undefined1 auVar1 [16];
  byte bVar2;
  ulong uVar3;
  uint128 uVar4;
  
  bVar2 = (byte)amount;
  if (0x3f < amount) {
    if ((uint)amount < 0x80) {
      uVar3 = val->lo_ << (bVar2 & 0x3f);
    }
    else {
      uVar3 = 0;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    return (uint128)(auVar1 << 0x40);
  }
  if (amount != 0) {
    uVar4.hi_ = val->hi_ << (bVar2 & 0x3f) | val->lo_ >> 0x40 - (bVar2 & 0x3f);
    uVar4.lo_ = val->lo_ << (bVar2 & 0x3f);
    return uVar4;
  }
  return *val;
}

Assistant:

inline uint128 operator<<(const uint128& val, int amount) {
  // uint64 shifts of >= 64 are undefined, so we will need some special-casing.
  if (amount < 64) {
    if (amount == 0) {
      return val;
    }
    uint64 new_hi = (Uint128High64(val) << amount) |
                    (Uint128Low64(val) >> (64 - amount));
    uint64 new_lo = Uint128Low64(val) << amount;
    return uint128(new_hi, new_lo);
  } else if (amount < 128) {
    return uint128(Uint128Low64(val) << (amount - 64), 0);
  } else {
    return uint128(0, 0);
  }
}